

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

void __thiscall Memory::Recycler::DumpObjectDescription(Recycler *this,void *objectAddress)

{
  code *pcVar1;
  bool bVar2;
  TrackerData *pTVar3;
  undefined4 *puVar4;
  type_info *typeinfo;
  
  if (this->trackerDictionary != (TypeInfotoTrackerItemMap *)0x0) {
    pTVar3 = GetTrackerData(this,objectAddress);
    if (pTVar3 != (TrackerData *)0x0) {
      typeinfo = pTVar3->typeinfo;
      bVar2 = pTVar3->isArray;
      goto LAB_00717978;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1f72,"(false)","false");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  bVar2 = false;
  typeinfo = (type_info *)0x0;
LAB_00717978:
  RecyclerObjectDumper::DumpObject(typeinfo,bVar2,objectAddress);
  return;
}

Assistant:

void
Recycler::DumpObjectDescription(void *objectAddress)
{
#ifdef PROFILE_RECYCLER_ALLOC
    type_info const * typeinfo = nullptr;
    bool isArray = false;

    if (this->trackerDictionary)
    {
        TrackerData * trackerData = GetTrackerData(objectAddress);
        if (trackerData != nullptr)
        {
            typeinfo = trackerData->typeinfo;
            isArray = trackerData->isArray;
        }
        else
        {
            Assert(false);
        }
    }
    RecyclerObjectDumper::DumpObject(typeinfo, isArray, objectAddress);
#else
    Output::Print(_u("Address %p"), objectAddress);
#endif
}